

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# output_writer.h
# Opt level: O0

OutputWriter * __thiscall
uttamarin::OutputWriter::operator<<
          (OutputWriter *this,
          basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *input)

{
  bool bVar1;
  reference ppbVar2;
  basic_ostream<char,_std::char_traits<char>_> *stream;
  iterator __end2;
  iterator __begin2;
  vector<std::basic_ostream<char,_std::char_traits<char>_>_*,_std::allocator<std::basic_ostream<char,_std::char_traits<char>_>_*>_>
  *__range2;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *input_local;
  OutputWriter *this_local;
  
  __end2._M_current =
       (basic_ostream<char,_std::char_traits<char>_> **)
       CLI::std::
       vector<std::basic_ostream<char,_std::char_traits<char>_>_*,_std::allocator<std::basic_ostream<char,_std::char_traits<char>_>_*>_>
       ::begin((vector<std::basic_ostream<char,_std::char_traits<char>_>_*,_std::allocator<std::basic_ostream<char,_std::char_traits<char>_>_*>_>
                *)this);
  stream = (basic_ostream<char,_std::char_traits<char>_> *)
           CLI::std::
           vector<std::basic_ostream<char,_std::char_traits<char>_>_*,_std::allocator<std::basic_ostream<char,_std::char_traits<char>_>_*>_>
           ::end((vector<std::basic_ostream<char,_std::char_traits<char>_>_*,_std::allocator<std::basic_ostream<char,_std::char_traits<char>_>_*>_>
                  *)this);
  while( true ) {
    bVar1 = __gnu_cxx::operator!=
                      (&__end2,(__normal_iterator<std::basic_ostream<char,_std::char_traits<char>_>_**,_std::vector<std::basic_ostream<char,_std::char_traits<char>_>_*,_std::allocator<std::basic_ostream<char,_std::char_traits<char>_>_*>_>_>
                                *)&stream);
    if (!bVar1) break;
    ppbVar2 = __gnu_cxx::
              __normal_iterator<std::basic_ostream<char,_std::char_traits<char>_>_**,_std::vector<std::basic_ostream<char,_std::char_traits<char>_>_*,_std::allocator<std::basic_ostream<char,_std::char_traits<char>_>_*>_>_>
              ::operator*(&__end2);
    std::operator<<((ostream *)*ppbVar2,(string *)input);
    __gnu_cxx::
    __normal_iterator<std::basic_ostream<char,_std::char_traits<char>_>_**,_std::vector<std::basic_ostream<char,_std::char_traits<char>_>_*,_std::allocator<std::basic_ostream<char,_std::char_traits<char>_>_*>_>_>
    ::operator++(&__end2);
  }
  return this;
}

Assistant:

OutputWriter& OutputWriter::operator<<(T input) {
  for(auto stream : streams_){
    *stream << input;
  }
  return *this;
}